

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_initialize(REF_GEOM ref_geom)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom;
  REF_GEOM ref_geom_local;
  
  ref_geom->n = 0;
  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_geom->max;
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
    ref_geom->descr[ref_private_macro_code_rss_1 * 6] = -1;
    ref_geom->descr[ref_private_macro_code_rss_1 * 6 + 1] = ref_private_macro_code_rss_1 + 1;
  }
  ref_geom->descr[(ref_geom->max + -1) * 6 + 1] = -1;
  ref_geom->blank = 0;
  if ((ref_geom->ref_adj == (REF_ADJ)0x0) ||
     (ref_geom_local._4_4_ = ref_adj_free(ref_geom->ref_adj), ref_geom_local._4_4_ == 0)) {
    ref_geom_local._4_4_ = ref_adj_create(&ref_geom->ref_adj);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x36,
             "ref_geom_initialize",(ulong)ref_geom_local._4_4_,"create ref_adj for ref_geom");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x35,
           "ref_geom_initialize",(ulong)ref_geom_local._4_4_,"free to prevent leak");
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_initialize(REF_GEOM ref_geom) {
  REF_INT geom;
  ref_geom_n(ref_geom) = 0;
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    ref_geom_type(ref_geom, geom) = REF_EMPTY;
    ref_geom_id(ref_geom, geom) = geom + 1;
  }
  ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
  ref_geom_blank(ref_geom) = 0;
  if (NULL != (void *)(ref_geom->ref_adj))
    RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  return REF_SUCCESS;
}